

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O2

void writeCompressData(iostream *outFile,JPG *jpg)

{
  uint uVar1;
  int value;
  MCU *pMVar2;
  Block *paiVar3;
  JPG *pJVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  HuffmanTable *pHVar9;
  Block **ppaiVar10;
  Block *block;
  ostream *poVar11;
  runtime_error *this;
  uint q;
  uint uVar12;
  long lVar13;
  uint ID;
  byte bVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  int *piVar19;
  uint local_e8;
  uint local_e4;
  ByteWriter writer;
  int lastDC [4];
  
  writer.bitPosition = 0;
  writer.bitstring = '\0';
  writer.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  writer.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  writer.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  writer.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  writer._36_8_ = 0;
  lastDC[0] = 0;
  lastDC[1] = 0;
  lastDC[2] = 0;
  lastDC[3] = 0;
  uVar8 = 0;
  writer.output = outFile;
  do {
    if (jpg->mcuHeight <= uVar8) {
      ByteWriter::flush(&writer);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar11 = std::operator<<(poVar11," bytes written to the compressed data");
      std::endl<char,std::char_traits<char>>(poVar11);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&writer.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    for (uVar12 = 0; uVar1 = jpg->mcuWidth, uVar12 < uVar1; uVar12 = uVar12 + 1) {
      pMVar2 = jpg->data;
      for (lVar15 = 1; lVar15 != 4; lVar15 = lVar15 + 1) {
        pHVar9 = &jpg->chromaAC;
        pJVar4 = (JPG *)&jpg->chromaDC;
        if (lVar15 == 1) {
          pHVar9 = &jpg->yAC;
          pJVar4 = jpg;
        }
        local_e8 = 0;
        while( true ) {
          ID = (uint)lVar15;
          uVar7 = JPG::getVerticalSamplingFrequency(jpg,ID);
          if (uVar7 <= local_e8) break;
          for (local_e4 = 0; uVar7 = JPG::getHorizontalSamplingFrequency(jpg,ID), local_e4 < uVar7;
              local_e4 = local_e4 + 1) {
            ppaiVar10 = MCU::operator[](pMVar2 + (uVar1 * uVar8 + uVar12),ID);
            paiVar3 = *ppaiVar10;
            uVar7 = JPG::getHorizontalSamplingFrequency(jpg,ID);
            std::operator<<((ostream *)&std::cout,"Block\n");
            uVar18 = uVar7 * local_e8 + local_e4;
            block = paiVar3 + uVar18;
            piVar19 = paiVar3[uVar18];
            for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
              for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
                iVar16 = piVar19[lVar13];
                if (-1 < iVar16) {
                  std::operator<<((ostream *)&std::cout," ");
                  iVar16 = piVar19[lVar13];
                }
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
                std::operator<<(poVar11," ");
              }
              std::operator<<((ostream *)&std::cout,"\n");
              piVar19 = piVar19 + 8;
            }
            iVar16 = (*block)[0] - lastDC[lVar15];
            lastDC[lVar15] = (*block)[0];
            bVar5 = getBinaryLengthByValue(iVar16);
            ByteWriter::writeBit
                      (&writer,(pJVar4->yDC).codeOfSymbol[bVar5],
                       (pJVar4->yDC).codeLengthOfSymbol[bVar5]);
            if (bVar5 != 0) {
              uVar7 = getRawBit(iVar16,(uint)bVar5);
              ByteWriter::writeBit(&writer,uVar7,(uint)bVar5);
            }
            iVar16 = 0;
            for (lVar17 = -0x3f; lVar17 != 0; lVar17 = lVar17 + 1) {
              value = (*block)[(byte)"Error - Length 0 is not allowed"[lVar17]];
              if (value == 0) {
                if (lVar17 != -1) {
                  iVar16 = iVar16 + 1;
                  if (iVar16 != 0x10) goto LAB_001048f0;
                  bVar6 = isRemainingAllZero(block,(int)lVar17 + 0x41);
                  if (!bVar6) {
                    ByteWriter::writeBit
                              (&writer,pHVar9->codeOfSymbol[0xf0],pHVar9->codeLengthOfSymbol[0xf0]);
                    goto LAB_001048ed;
                  }
                }
                ByteWriter::writeBit(&writer,pHVar9->codeOfSymbol[0],pHVar9->codeLengthOfSymbol[0]);
                break;
              }
              bVar5 = getBinaryLengthByValue(value);
              bVar14 = (char)iVar16 * '\x10' + bVar5;
              uVar7 = pHVar9->codeLengthOfSymbol[bVar14];
              if (uVar7 == 0) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Error -find error");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              ByteWriter::writeBit(&writer,pHVar9->codeOfSymbol[bVar14],uVar7);
              uVar7 = getRawBit(value,(uint)bVar5);
              ByteWriter::writeBit(&writer,uVar7,(uint)bVar5);
LAB_001048ed:
              iVar16 = 0;
LAB_001048f0:
            }
          }
          local_e8 = local_e8 + 1;
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void writeCompressData(std::iostream& outFile, const JPG& jpg) {
    ByteWriter writer(outFile);
    int lastDC[4] = { 0 };
    for (uint i = 0; i < jpg.mcuHeight; i++) {
        for (uint j = 0; j < jpg.mcuWidth; j++) {
            MCU& currentMCU = jpg.data[i * jpg.mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for(uint componentID = 1; componentID <= 3; componentID++) {
                for(uint ii = 0; ii < jpg.getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < jpg.getHorizontalSamplingFrequency(componentID); jj++) {

                        Block& currentBlock = currentMCU[componentID][ii * jpg.getHorizontalSamplingFrequency(componentID) + jj];
                        std::cout << "Block\n";
                        for(uint k = 0; k < 8; k++) {
                            for(uint q = 0; q < 8; q++) {
                                if(currentBlock[k * 8 + q] >= 0)
                                    std::cout << " ";
                                std::cout << currentBlock[k * 8 + q] << " ";
                            }
                            std::cout << "\n";
                        }
                        
                        byte symbol;
                        //先写DC分量
                        const HuffmanTable& dcTable = jpg.getHuffmanDCTable(componentID);
                        int difference = currentBlock[0] - lastDC[componentID]; //DC分量是encode difference
                        lastDC[componentID] = currentBlock[0];

                        //对于DC来说symbol 就是length
                        symbol = getBinaryLengthByValue(difference); //Y的2进制的长度就是symbol的值// 
                        uint magnitude = symbol;
                        writer.writeBit(dcTable.codeOfSymbol[symbol], dcTable.codeLengthOfSymbol[symbol]);
                        if(magnitude != 0) { //长度不为0的话，需要把row bit 写进去
                            uint rowBit = getRawBit(difference, symbol);
                            writer.writeBit(rowBit, magnitude);
                        }
                        
                        //write raw bits;
                        //写AC分量
                        const HuffmanTable& acTable = jpg.getHuffmanACTable(componentID);
                        uint numZero = 0;
                        for(uint k = 1; k < 64; k++) {
                            int currentValue = currentBlock[ZIG_ZAG[k]];
                            if(currentValue == 0) {
                                if(k == 63) {
                                    symbol = 0x00;
                                    writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                    break;
                                }
                                numZero++;
                                if(numZero == 16) {
                                    if(isRemainingAllZero(currentBlock, k + 1)) {
                                        symbol = 0x00;
                                        writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                        break;
                                    } else {
                                        symbol = 0xF0;
                                        writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                        numZero = 0;
                                    }
                                }
                            } else {
                                byte lengthOfCoefficient = getBinaryLengthByValue(currentValue);
                                symbol = (numZero << 4) + lengthOfCoefficient;
                                if(acTable.codeLengthOfSymbol[symbol] == 0) {
                                    throw std::runtime_error("Error -find error");
                                }
                                writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                uint rowBit = getRawBit(currentValue, lengthOfCoefficient);
                                //write raw bits;
                                writer.writeBit(rowBit, lengthOfCoefficient);
                                numZero = 0;
                            }
                        }

                    }
                }
            }
        }
    }
    writer.flush();
    std::cout <<writer.bytesWritten << " bytes written to the compressed data"<< std::endl;
}